

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly_mul_x_minus_1(poly *p)

{
  uint16_t uVar1;
  long local_20;
  size_t i;
  uint16_t orig_final_coefficient;
  poly *p_local;
  
  uVar1 = (p->field_0).v[700];
  for (local_20 = 700; local_20 != 0; local_20 = local_20 + -1) {
    (p->field_0).v[local_20] = *(short *)((long)p + (local_20 + -1) * 2) - (p->field_0).v[local_20];
  }
  (p->field_0).v[0] = uVar1 - (p->field_0).v[0];
  return;
}

Assistant:

static void poly_mul_x_minus_1(struct poly *p) {
  // Multiplying by (𝑥 - 1) means negating each coefficient and adding in
  // the value of the previous one.
  const uint16_t orig_final_coefficient = p->v[N - 1];

  for (size_t i = N - 1; i > 0; i--) {
    p->v[i] = p->v[i - 1] - p->v[i];
  }
  p->v[0] = orig_final_coefficient - p->v[0];
}